

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void recharged_notice(object *obj,_Bool all)

{
  bool bVar1;
  char *__s;
  char *pcStack_a0;
  _Bool notify;
  char *s;
  char o_name [120];
  _Bool all_local;
  object *obj_local;
  
  bVar1 = false;
  if (((player->opts).opt[0x14] & 1U) == 0) {
    if (obj->note != 0) {
      __s = quark_str(obj->note);
      for (pcStack_a0 = strchr(__s,0x21); pcStack_a0 != (char *)0x0;
          pcStack_a0 = strchr(pcStack_a0 + 1,0x21)) {
        if (pcStack_a0[1] == '!') {
          bVar1 = true;
          break;
        }
      }
    }
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    object_desc((char *)&s,0x78,obj,0,player);
    disturb(player);
    if (obj->number < 2) {
      if (obj->artifact == (artifact *)0x0) {
        msg("Your %s has recharged.",&s);
      }
      else {
        msg("The %s has recharged.",&s);
      }
    }
    else if (all) {
      msg("Your %s have recharged.",&s);
    }
    else {
      msg("One of your %s has recharged.",&s);
    }
  }
  return;
}

Assistant:

static void recharged_notice(const struct object *obj, bool all)
{
	char o_name[120];

	const char *s;

	bool notify = false;

	if (OPT(player, notify_recharge)) {
		notify = true;
	} else if (obj->note) {
		/* Find a '!' */
		s = strchr(quark_str(obj->note), '!');

		/* Process notification request */
		while (s) {
			/* Find another '!' */
			if (s[1] == '!') {
				notify = true;
				break;
			}

			/* Keep looking for '!'s */
			s = strchr(s + 1, '!');
		}
	}

	if (!notify) return;

	/* Describe (briefly) */
	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

	/* Disturb the player */
	disturb(player);

	/* Notify the player */
	if (obj->number > 1) {
		if (all) msg("Your %s have recharged.", o_name);
		else msg("One of your %s has recharged.", o_name);
	} else if (obj->artifact)
		msg("The %s has recharged.", o_name);
	else
		msg("Your %s has recharged.", o_name);
}